

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

void tele_trap(trap *trap)

{
  boolean bVar1;
  trap *trap_local;
  
  if (((u.uz.dnum == dungeon_topology.d_astral_level.dnum) || (u.uprops[0x2c].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar1 = resists_magm(&youmonst), bVar1 != '\0')))) {
    if ((u.uprops[0x2c].extrinsic != 0) ||
       ((u.umonnum != u.umonster && (bVar1 = resists_magm(&youmonst), bVar1 != '\0')))) {
      shieldeff(u.ux,u.uy);
    }
    pline("You feel a wrenching sensation.");
  }
  else {
    bVar1 = next_to_u();
    if (bVar1 == '\0') {
      pline("You shudder for a moment.");
    }
    else if (((byte)trap->field_0x8 >> 6 & 1) == 0) {
      tele((char *)0x0);
    }
    else {
      deltrap(level,trap);
      newsym((int)u.ux,(int)u.uy);
      vault_tele();
    }
  }
  return;
}

Assistant:

void tele_trap(struct trap *trap)
{
	if (In_endgame(&u.uz) || Antimagic) {
		if (Antimagic)
			shieldeff(u.ux, u.uy);
		pline("You feel a wrenching sensation.");
	} else if (!next_to_u()) {
		pline("You shudder for a moment.");
	} else if (trap->once) {
		deltrap(level, trap);
		newsym(u.ux,u.uy);	/* get rid of trap symbol */
		vault_tele();
	} else
		tele(NULL);
}